

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsPathItem::QGraphicsPathItem
          (QGraphicsPathItem *this,QPainterPath *path,QGraphicsItem *parent)

{
  char cVar1;
  QGraphicsPathItemPrivate *this_00;
  
  this_00 = (QGraphicsPathItemPrivate *)operator_new(0x1b0);
  QGraphicsPathItemPrivate::QGraphicsPathItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
            (&this->super_QAbstractGraphicsShapeItem,(QAbstractGraphicsShapeItemPrivate *)this_00,
             parent);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_007eb858;
  cVar1 = QPainterPath::isEmpty();
  if (cVar1 != '\0') {
    return;
  }
  setPath(this,path);
  return;
}

Assistant:

QGraphicsPathItem::QGraphicsPathItem(const QPainterPath &path,
                                     QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPathItemPrivate, parent)
{
    if (!path.isEmpty())
        setPath(path);
}